

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 floatx80_to_float128_mips64(floatx80 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  ulong uVar4;
  float128 fVar5;
  floatx80 a_00;
  commonNaNT local_20;
  
  uVar2 = a.low;
  uVar3 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar2 < 0)
  {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        uVar3 != 0x7fff) {
      uVar1 = uVar2 << 0x31;
      uVar2 = (a._8_8_ >> 0xf) << 0x3f | uVar2 >> 0xf & 0xffffffffffff;
      uVar4 = (ulong)uVar3 << 0x30;
      goto LAB_0086d138;
    }
    a_00._8_8_ = a._8_8_ & 0xffffffff;
    a_00.low = uVar2;
    floatx80ToCommonNaN(&local_20,a_00,status);
    if (status->default_nan_mode != '\0') goto LAB_0086d10c;
    uVar1 = local_20.low >> 0x10 | local_20.high << 0x30;
    uVar2 = (ulong)(uint)local_20._0_4_ << 0x3f | local_20.high >> 0x10;
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 1;
LAB_0086d10c:
    uVar2 = 0x2000000000000000;
    if (status->snan_bit_is_one != '\0') {
      uVar2 = 0x1fffffffffffffff;
    }
    uVar1 = -(ulong)((uint)uVar2 & 1);
    uVar2 = uVar2 >> 0xe;
  }
  uVar4 = 0x7fff000000000000;
LAB_0086d138:
  fVar5.high = uVar4 | uVar2;
  fVar5.low = uVar1;
  return fVar5;
}

Assistant:

float128 floatx80_to_float128(floatx80 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) {
        return commonNaNToFloat128(floatx80ToCommonNaN(a, status), status);
    }
    shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp, zSig0, zSig1 );

}